

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

xchar ledger_to_dnum(xchar ledgerno)

{
  xchar *pxVar1;
  long lVar2;
  
  if (0 < (long)n_dgns) {
    pxVar1 = &dungeons[0].num_dunlevs;
    lVar2 = 0;
    do {
      if ((*(int *)(pxVar1 + 3) < (int)ledgerno) &&
         ((int)ledgerno <= *(int *)(pxVar1 + 3) + (int)*pxVar1)) {
        return (xchar)lVar2;
      }
      lVar2 = lVar2 + 1;
      pxVar1 = pxVar1 + 0x38;
    } while (n_dgns != lVar2);
  }
  panic("level number out of range [ledger_to_dnum(%d)]");
}

Assistant:

xchar ledger_to_dnum(xchar ledgerno)
{
	int i;

	/* find i such that (i->base + 1) <= ledgerno <= (i->base + i->count) */
	for (i = 0; i < n_dgns; i++)
	    if (dungeons[i].ledger_start < ledgerno &&
		ledgerno <= dungeons[i].ledger_start + dungeons[i].num_dunlevs)
		return (xchar)i;

	panic("level number out of range [ledger_to_dnum(%d)]", (int)ledgerno);
	/*NOT REACHED*/
	return (xchar)0;
}